

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_MissingReturnThrows_Test::~SemanticAnalyserTest_MissingReturnThrows_Test
          (SemanticAnalyserTest_MissingReturnThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, MissingReturnThrows)
{
  std::string source = R"SRC(
  fn func(): f32
  {
  }

  fn main(): f32
  {
   ret 0; 
  }
  )SRC";
  throwTest(source);
}